

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOptimizationTests.cpp
# Opt level: O0

string * deqp::gles3::Performance::repeat
                   (string *__return_storage_ptr__,string *str,int numRepeats,string *delim)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int local_30;
  undefined1 local_29;
  int i;
  string *delim_local;
  string *psStack_18;
  int numRepeats_local;
  string *str_local;
  string *result;
  
  local_29 = 0;
  _i = delim;
  delim_local._4_4_ = numRepeats;
  psStack_18 = str;
  str_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  for (local_30 = 1; local_30 < delim_local._4_4_; local_30 = local_30 + 1) {
    std::operator+(&local_50,_i,psStack_18);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

static inline string repeat (const string& str, int numRepeats, const string& delim = "")
{
	string result = str;
	for (int i = 1; i < numRepeats; i++)
		result += delim + str;
	return result;
}